

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O1

Document * __thiscall svg::Document::operator<<(Document *this,Shape *shape)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (*(shape->super_Serializeable)._vptr_Serializeable[2])(local_38,shape,&this->layout);
  std::__cxx11::string::_M_append((char *)&this->body_nodes_str,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return this;
}

Assistant:

Document & operator<<(Shape const & shape)
        {
            body_nodes_str += shape.toString(layout);
            return *this;
        }